

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O1

void __thiscall
TEST_SimpleString_Concatenation_Test::testBody(TEST_SimpleString_Concatenation_Test *this)

{
  bool bVar1;
  UtestShell *pUVar2;
  char *pcVar3;
  char *pcVar4;
  TestTerminator *pTVar5;
  SimpleString s4;
  SimpleString s5;
  SimpleString local_68;
  SimpleString s3;
  SimpleString local_48;
  SimpleString s2;
  SimpleString s1;
  
  SimpleString::SimpleString(&s1,"hello!");
  SimpleString::SimpleString(&s2,"goodbye!");
  SimpleString::SimpleString(&s3,"hello!goodbye!");
  SimpleString::SimpleString(&s4,"");
  SimpleString::operator+=(&s4,&s1);
  SimpleString::operator+=(&s4,&s2);
  bVar1 = operator!=(&s3,&s4);
  if (bVar1) {
    bVar1 = operator!=(&s4,&s4);
    if (bVar1) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1c])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
                 ,0x145);
    }
    bVar1 = operator!=(&s3,&s3);
    if (bVar1) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1c])
                (pUVar2,
                 "WARNING:\n\tThe \"Expected Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
                 ,0x145);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(&s5);
    pcVar3 = SimpleString::asCharString(&s5);
    StringFrom(&local_68);
    pcVar4 = SimpleString::asCharString(&local_68);
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar3,pcVar4,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
               ,0x145,pTVar5);
    SimpleString::~SimpleString(&local_68);
    SimpleString::~SimpleString(&s5);
  }
  else {
    pUVar2 = UtestShell::getCurrent();
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
               ,0x145,pTVar5);
  }
  SimpleString::SimpleString(&s5,"hello!goodbye!hello!goodbye!");
  SimpleString::operator+=(&s4,&s4);
  bVar1 = operator!=(&s5,&s4);
  if (bVar1) {
    bVar1 = operator!=(&s4,&s4);
    if (bVar1) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1c])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
                 ,0x14a);
    }
    bVar1 = operator!=(&s5,&s5);
    if (bVar1) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1c])
                (pUVar2,
                 "WARNING:\n\tThe \"Expected Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
                 ,0x14a);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(&local_68);
    pcVar3 = SimpleString::asCharString(&local_68);
    StringFrom(&local_48);
    pcVar4 = SimpleString::asCharString(&local_48);
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar3,pcVar4,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
               ,0x14a,pTVar5);
    SimpleString::~SimpleString(&local_48);
    SimpleString::~SimpleString(&local_68);
  }
  else {
    pUVar2 = UtestShell::getCurrent();
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
               ,0x14a,pTVar5);
  }
  SimpleString::~SimpleString(&s5);
  SimpleString::~SimpleString(&s4);
  SimpleString::~SimpleString(&s3);
  SimpleString::~SimpleString(&s2);
  SimpleString::~SimpleString(&s1);
  return;
}

Assistant:

TEST(SimpleString, Concatenation)
{
    SimpleString s1("hello!");
    SimpleString s2("goodbye!");
    SimpleString s3("hello!goodbye!");
    SimpleString s4;
    s4 += s1;
    s4 += s2;

    CHECK_EQUAL(s3, s4);

    SimpleString s5("hello!goodbye!hello!goodbye!");
    s4 += s4;

    CHECK_EQUAL(s5, s4);
}